

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

string * __thiscall pugi::xml_node::path_abi_cxx11_(xml_node *this,char_t delimiter)

{
  void *__src;
  undefined1 *puVar1;
  size_t __n;
  void *__dest;
  undefined1 in_DL;
  long *in_RSI;
  string *in_RDI;
  size_t length;
  char_t *jname;
  xml_node_struct *j;
  char_t *iname;
  xml_node_struct *i;
  size_t offset;
  string_t *result;
  long local_50;
  long local_28;
  
  if (*in_RSI == 0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    for (local_28 = *in_RSI; local_28 != 0; local_28 = *(long *)(local_28 + 0x18)) {
      if (*(long *)(local_28 + 8) != 0) {
        impl::anon_unknown_0::strlength((char_t *)0x1dca25);
      }
    }
    std::__cxx11::string::string(in_RDI);
    std::__cxx11::string::resize((ulong)in_RDI);
    for (local_50 = *in_RSI; local_50 != 0; local_50 = *(long *)(local_50 + 0x18)) {
      if (local_50 != *in_RSI) {
        puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
        *puVar1 = in_DL;
      }
      __src = *(void **)(local_50 + 8);
      if (__src != (void *)0x0) {
        __n = impl::anon_unknown_0::strlength((char_t *)0x1dcb27);
        __dest = (void *)std::__cxx11::string::operator[]((ulong)in_RDI);
        memcpy(__dest,__src,__n);
      }
    }
  }
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN string_t xml_node::path(char_t delimiter) const
	{
		if (!_root) return string_t();

		size_t offset = 0;

		for (xml_node_struct* i = _root; i; i = i->parent)
		{
			const char_t* iname = i->name;
			offset += (i != _root);
			offset += iname ? impl::strlength(iname) : 0;
		}

		string_t result;
		result.resize(offset);

		for (xml_node_struct* j = _root; j; j = j->parent)
		{
			if (j != _root)
				result[--offset] = delimiter;

			const char_t* jname = j->name;
			if (jname)
			{
				size_t length = impl::strlength(jname);

				offset -= length;
				memcpy(&result[offset], jname, length * sizeof(char_t));
			}
		}

		assert(offset == 0);

		return result;
	}